

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

bool PartStream_BlockRead
               (TBlockStream *pStream,ULONGLONG StartOffset,ULONGLONG EndOffset,LPBYTE BlockBuffer,
               DWORD BytesNeeded,bool bAvailable)

{
  uint uVar1;
  TFileStream *pTVar2;
  bool bVar3;
  undefined4 *puVar4;
  DWORD DVar5;
  ulong uVar6;
  void *pvVar7;
  ULONGLONG ByteOffset;
  ulong local_40;
  ULONGLONG local_38;
  
  local_40 = StartOffset;
  if (pStream->FileBitmap == (void *)0x0) {
    __assert_fail("pStream->FileBitmap != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x644,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if ((pStream->BlockSize - 1 & (uint)StartOffset) != 0) {
    __assert_fail("(StartOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x645,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (EndOffset <= StartOffset) {
    __assert_fail("StartOffset < EndOffset",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x646,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (bAvailable) {
    bVar3 = true;
    if (StartOffset < EndOffset) {
      pvVar7 = (void *)((long)pStream->FileBitmap +
                       (StartOffset / pStream->BlockSize & 0xffffffff) * 0x14);
      do {
        DVar5 = (int)EndOffset - (int)local_40;
        if (pStream->BlockSize < DVar5) {
          DVar5 = pStream->BlockSize;
        }
        if (BytesNeeded <= DVar5) {
          DVar5 = BytesNeeded;
        }
        local_38 = *(ULONGLONG *)((long)pvVar7 + 4);
        bVar3 = (*(pStream->super_TFileStream).BaseRead)
                          (&pStream->super_TFileStream,&local_38,BlockBuffer,DVar5);
        if (!bVar3) {
          return bVar3;
        }
        uVar1 = pStream->BlockSize;
        BlockBuffer = BlockBuffer + uVar1;
        local_40 = uVar1 + local_40;
        BytesNeeded = BytesNeeded - uVar1;
        pvVar7 = (void *)((long)pvVar7 + 0x14);
      } while (local_40 < EndOffset);
    }
  }
  else {
    pTVar2 = (pStream->super_TFileStream).pMaster;
    if (pTVar2 != (TFileStream *)0x0) {
      if (pTVar2->StreamRead == (STREAM_READ)0x0) {
        __assert_fail("pStream->StreamRead != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                      ,0xa1c,"bool FileStream_Read(TFileStream *, ULONGLONG *, void *, DWORD)");
      }
      DVar5 = (int)EndOffset - (uint)StartOffset;
      bVar3 = (*pTVar2->StreamRead)(pTVar2,&local_40,BlockBuffer,DVar5);
      if (bVar3) {
        bVar3 = (*(pStream->super_TFileStream).BaseGetSize)(&pStream->super_TFileStream,&local_38);
        if (!bVar3) {
          return true;
        }
        bVar3 = (*(pStream->super_TFileStream).BaseWrite)
                          (&pStream->super_TFileStream,&local_38,BlockBuffer,DVar5);
        if (!bVar3) {
          return true;
        }
        uVar6 = (ulong)pStream->BlockSize;
        if (((uint)local_40 & pStream->BlockSize - 1) != 0) {
          __assert_fail("(StartOffset & (BlockSize - 1)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                        ,0x60d,
                        "void PartStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG, ULONGLONG)"
                       );
        }
        if (pStream->FileBitmap != (void *)0x0) {
          if (local_40 < EndOffset) {
            puVar4 = (undefined4 *)((long)pStream->FileBitmap + (local_40 / uVar6) * 0x14);
            do {
              *(ULONGLONG *)(puVar4 + 1) = local_38;
              *puVar4 = 3;
              local_40 = local_40 + uVar6;
              local_38 = local_38 + uVar6;
              puVar4 = puVar4 + 5;
            } while (local_40 < EndOffset);
          }
          pStream->IsModified = 1;
          return true;
        }
        __assert_fail("pStream->FileBitmap != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                      ,0x60e,
                      "void PartStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG, ULONGLONG)"
                     );
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool PartStream_BlockRead(
    TBlockStream * pStream,
    ULONGLONG StartOffset,
    ULONGLONG EndOffset,
    LPBYTE BlockBuffer,
    DWORD BytesNeeded,
    bool bAvailable)
{
    PPART_FILE_MAP_ENTRY FileBitmap;
    ULONGLONG ByteOffset;
    DWORD BytesToRead;
    DWORD BlockIndex = (DWORD)(StartOffset / pStream->BlockSize);

    // The starting offset must be aligned to size of the block
    assert(pStream->FileBitmap != NULL);
    assert((StartOffset & (pStream->BlockSize - 1)) == 0);
    assert(StartOffset < EndOffset);

    // If the blocks are not available, we need to load them from the master
    // and then save to the mirror
    if(bAvailable == false)
    {
        // If we have no master, we cannot satisfy read request
        if(pStream->pMaster == NULL)
            return false;

        // Load the blocks from the master stream
        // Note that we always have to read complete blocks
        // so they get properly stored to the mirror stream
        BytesToRead = (DWORD)(EndOffset - StartOffset);
        if(!FileStream_Read(pStream->pMaster, &StartOffset, BlockBuffer, BytesToRead))
            return false;

        // The loaded blocks are going to be stored to the end of the file
        // Note that this operation is not required to succeed
        if(pStream->BaseGetSize(pStream, &ByteOffset))
        {
            // Store the loaded blocks to the mirror file.
            if(pStream->BaseWrite(pStream, &ByteOffset, BlockBuffer, BytesToRead))
            {
                PartStream_UpdateBitmap(pStream, StartOffset, EndOffset, ByteOffset);
            }
        }
    }
    else
    {
        // Get the file map entry
        FileBitmap = (PPART_FILE_MAP_ENTRY)pStream->FileBitmap + BlockIndex;

        // Read all blocks
        while(StartOffset < EndOffset)
        {
            // Get the number of bytes to be read
            BytesToRead = (DWORD)(EndOffset - StartOffset);
            if(BytesToRead > pStream->BlockSize)
                BytesToRead = pStream->BlockSize;
            if(BytesToRead > BytesNeeded)
                BytesToRead = BytesNeeded;

            // Read the block
            ByteOffset = MAKE_OFFSET64(FileBitmap->BlockOffsHi, FileBitmap->BlockOffsLo);
            if(!pStream->BaseRead(pStream, &ByteOffset, BlockBuffer, BytesToRead))
                return false;

            // Move the pointers
            StartOffset += pStream->BlockSize;
            BlockBuffer += pStream->BlockSize;
            BytesNeeded -= pStream->BlockSize;
            FileBitmap++;
        }
    }

    return true;
}